

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_null(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  int result;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = encode_null_constructor(encoder_output,context);
  if ((iVar1 == 0) && (iVar1 = encode_null_value(encoder_output,context), iVar1 == 0)) {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
              ,"encode_null",0x923,1,"Failed encoding NULL");
  }
  return 0x924;
}

Assistant:

static int encode_null(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    if ((encode_null_constructor(encoder_output, context) != 0) ||
        (encode_null_value(encoder_output, context) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding NULL");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}